

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_csv_state.cpp
# Opt level: O1

void __thiscall duckdb::CSVGlobalState::FillRejectsTable(CSVGlobalState *this,CSVFileScan *scan)

{
  pointer limit;
  iterator __position;
  int iVar1;
  pointer pTVar2;
  CSVRejectsTable *pCVar3;
  CSVRejectsTable *pCVar4;
  TableCatalogEntry *table_p;
  TableCatalogEntry *table_p_00;
  idx_t query_id;
  idx_t iVar5;
  reference pvVar6;
  CSVErrorHandler *this_00;
  type rejects_00;
  ulong uVar7;
  shared_ptr<duckdb::CSVRejectsTable,_true> rejects;
  unsigned_long local_198;
  InternalAppender scans_appender;
  InternalAppender errors_appender;
  
  pTVar2 = unique_ptr<duckdb::TableFunctionData,_std::default_delete<duckdb::TableFunctionData>,_true>
           ::operator->(&this->bind_data->bind_data);
  if (*(char *)((long)&pTVar2[5].column_ids.
                       super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_finish + 3) == '\x01') {
    limit = pTVar2[8].column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start;
    CSVRejectsTable::GetOrCreate
              ((CSVRejectsTable *)&rejects,this->context,(string *)&pTVar2[7].column_ids,
               (string *)(pTVar2 + 6));
    pCVar3 = shared_ptr<duckdb::CSVRejectsTable,_true>::operator->(&rejects);
    iVar1 = pthread_mutex_lock((pthread_mutex_t *)&pCVar3->write_lock);
    if (iVar1 != 0) {
      ::std::__throw_system_error(iVar1);
    }
    pCVar4 = shared_ptr<duckdb::CSVRejectsTable,_true>::operator->(&rejects);
    table_p = CSVRejectsTable::GetErrorsTable(pCVar4,this->context);
    pCVar4 = shared_ptr<duckdb::CSVRejectsTable,_true>::operator->(&rejects);
    table_p_00 = CSVRejectsTable::GetScansTable(pCVar4,this->context);
    InternalAppender::InternalAppender(&errors_appender,this->context,table_p,0x32000);
    InternalAppender::InternalAppender(&scans_appender,this->context,table_p_00,0x32000);
    query_id = TransactionContext::GetActiveQuery(&this->context->transaction);
    iVar5 = optional_idx::GetIndex(&(scan->super_BaseFileReader).file_list_idx);
    uVar7 = (long)(this->rejects_file_indexes).
                  super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(this->rejects_file_indexes).
                  super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start >> 3;
    if (uVar7 <= iVar5) {
      do {
        pCVar4 = shared_ptr<duckdb::CSVRejectsTable,_true>::operator->(&rejects);
        local_198 = CSVRejectsTable::GetCurrentFileIndex(pCVar4,query_id);
        __position._M_current =
             (this->rejects_file_indexes).
             super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->rejects_file_indexes).super_vector<unsigned_long,_std::allocator<unsigned_long>_>
            .super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
          _M_realloc_insert<unsigned_long>
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                     &this->rejects_file_indexes,__position,&local_198);
        }
        else {
          *__position._M_current = local_198;
          (this->rejects_file_indexes).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
        uVar7 = uVar7 + 1;
      } while (uVar7 <= iVar5);
    }
    pvVar6 = vector<unsigned_long,_true>::operator[](&this->rejects_file_indexes,iVar5);
    iVar5 = *pvVar6;
    this_00 = shared_ptr<duckdb::CSVErrorHandler,_true>::operator->(&scan->error_handler);
    rejects_00 = shared_ptr<duckdb::CSVRejectsTable,_true>::operator*(&rejects);
    CSVErrorHandler::FillRejectsTable
              (this_00,&errors_appender,iVar5,query_id,scan,rejects_00,this->bind_data,(idx_t)limit)
    ;
    pCVar4 = shared_ptr<duckdb::CSVRejectsTable,_true>::operator->(&rejects);
    if (pCVar4->count != 0) {
      pCVar4 = shared_ptr<duckdb::CSVRejectsTable,_true>::operator->(&rejects);
      pCVar4->count = 0;
      FillScanErrorTable(&scans_appender,query_id,iVar5,scan);
    }
    BaseAppender::Close(&errors_appender.super_BaseAppender);
    BaseAppender::Close(&scans_appender.super_BaseAppender);
    InternalAppender::~InternalAppender(&scans_appender);
    InternalAppender::~InternalAppender(&errors_appender);
    pthread_mutex_unlock((pthread_mutex_t *)&pCVar3->write_lock);
    if (rejects.internal.super___shared_ptr<duckdb::CSVRejectsTable,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (rejects.internal.
                 super___shared_ptr<duckdb::CSVRejectsTable,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                 ._M_pi);
    }
  }
  return;
}

Assistant:

void CSVGlobalState::FillRejectsTable(CSVFileScan &scan) {
	auto &csv_data = bind_data.bind_data->Cast<ReadCSVData>();
	auto &options = csv_data.options;

	if (!options.store_rejects.GetValue()) {
		return;
	}
	auto limit = options.rejects_limit;
	auto rejects = CSVRejectsTable::GetOrCreate(context, options.rejects_scan_name.GetValue(),
	                                            options.rejects_table_name.GetValue());
	lock_guard<mutex> lock(rejects->write_lock);
	auto &errors_table = rejects->GetErrorsTable(context);
	auto &scans_table = rejects->GetScansTable(context);
	InternalAppender errors_appender(context, errors_table);
	InternalAppender scans_appender(context, scans_table);
	idx_t scan_idx = context.transaction.GetActiveQuery();

	// get the file indexes for the rejects table
	// we store these so that they are deterministic (i.e. file index 0 always gets the lowest rejects index)
	// otherwise parallelism can result in out-of-order file indexes
	auto file_idx = scan.GetFileIndex();
	for (idx_t i = rejects_file_indexes.size(); i <= file_idx; i++) {
		rejects_file_indexes.push_back(rejects->GetCurrentFileIndex(scan_idx));
	}
	const idx_t rejects_file_idx = rejects_file_indexes[file_idx];
	scan.error_handler->FillRejectsTable(errors_appender, rejects_file_idx, scan_idx, scan, *rejects, bind_data, limit);
	if (rejects->count != 0) {
		rejects->count = 0;
		FillScanErrorTable(scans_appender, scan_idx, rejects_file_idx, scan);
	}
	errors_appender.Close();
	scans_appender.Close();
}